

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmt_tests.cpp
# Opt level: O1

void __thiscall CPartialMerkleTreeTester::Damage(CPartialMerkleTreeTester *this)

{
  byte *pbVar1;
  long lVar2;
  FastRandomContext *this_00;
  long lVar3;
  uint uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = ((long)(this->super_CPartialMerkleTree).vHash.
                 super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->super_CPartialMerkleTree).vHash.
                 super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start >> 5) - 1;
  if (uVar7 == 0) {
    uVar4 = 0x40;
  }
  else {
    lVar3 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    uVar4 = (uint)lVar3 ^ 0x3f;
  }
  this_00 = this->m_rng;
  do {
    uVar5 = RandomMixin<FastRandomContext>::randbits
                      (&this_00->super_RandomMixin<FastRandomContext>,0x40 - uVar4);
  } while (uVar7 < uVar5);
  uVar6 = RandomMixin<FastRandomContext>::randbits
                    (&this->m_rng->super_RandomMixin<FastRandomContext>,8);
  pbVar1 = (byte *)((long)(this->super_CPartialMerkleTree).vHash.
                          super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar5 & 0xffffffff].super_base_blob<256U>
                          .m_data._M_elems + (long)((int)uVar6 >> 3));
  *pbVar1 = *pbVar1 ^ (byte)(1 << ((byte)uVar6 & 7));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Damage() {
        unsigned int n = m_rng.randrange(vHash.size());
        int bit = m_rng.randbits(8);
        *(vHash[n].begin() + (bit>>3)) ^= 1<<(bit&7);
    }